

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_j.c
# Opt level: O3

void test_option_j(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  size_t in_RAX;
  char *__ptr;
  size_t s;
  
  s = in_RAX;
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_j.c"
                      ,L'\x11',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = systemf("%s -jcf archive.out f 2>archive.err",testprog);
  __ptr = slurpfile(&s,"archive.err");
  __ptr[s] = '\0';
  if (wVar1 == L'\0') {
    free(__ptr);
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_j.c"
               ,L'!',"archive.err");
    __ptr = slurpfile(&s,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_j.c"
                     ,L'$',(uint)(2 < s),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_j.c"
                        ,L'%',__ptr,"p","BZh9","\"BZh9\"",4,"4",(void *)0x0);
  }
  else {
    wVar2 = canBzip2();
    if (wVar2 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_j.c"
                     ,L'\x19');
      test_skipping("bzip2 is not supported on this platform");
    }
    else {
      failure("-j option is broken");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_j.c"
                          ,L'\x1d',(long)wVar1,"r",0,"0",(void *)0x0);
    }
  }
  free(__ptr);
  return;
}

Assistant:

DEFINE_TEST(test_option_j)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with bzip2 compression. */
	r = systemf("%s -jcf archive.out f 2>archive.err", testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (!canBzip2()) {
			skipping("bzip2 is not supported on this platform");
			goto done;
		}
		failure("-j option is broken");
		assertEqualInt(r, 0);
		goto done;
	}
	free(p);
	assertEmptyFile("archive.err");
	/* Check that the archive file has a bzip2 signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "BZh9", 4);
done:
	free(p);
}